

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool QSslSocketPrivate::isMatchingHostname(QSslCertificate *cert,QString *peerName)

{
  bool bVar1;
  _Rb_tree_const_iterator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_> _Var2;
  long lVar3;
  const_iterator r;
  QString *commonName;
  QString *cn;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  pair<std::_Rb_tree_const_iterator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>,_std::_Rb_tree_const_iterator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
  pVar5;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames;
  QMultiMap<QSsl::AlternativeNameEntryType,_QString> subjectAlternativeNames_1;
  QHostAddress hostAddress;
  key_type local_84;
  QSslCertificate local_80;
  QArrayDataPointer<QString> local_78;
  QString local_58;
  QHostAddress local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_40,peerName);
  bVar1 = QHostAddress::isNull(&local_40);
  if (!bVar1) {
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QSslCertificate::subjectAlternativeNames((QSslCertificate *)&local_58);
    local_78.d = (Data *)CONCAT44(local_78.d._4_4_,2);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      pVar5 = std::
              _Rb_tree<QSsl::AlternativeNameEntryType,_std::pair<const_QSsl::AlternativeNameEntryType,_QString>,_std::_Select1st<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
              ::equal_range((_Rb_tree<QSsl::AlternativeNameEntryType,_std::pair<const_QSsl::AlternativeNameEntryType,_QString>,_std::_Select1st<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
                             *)((long)local_58.d.d + 8),(key_type *)&local_78);
      _Var2 = pVar5.first._M_node;
      if (_Var2._M_node != pVar5.second._M_node._M_node) {
        do {
          QHostAddress::QHostAddress
                    ((QHostAddress *)&local_78,(QString *)&_Var2._M_node[1]._M_parent);
          bVar1 = QHostAddress::isEqual((QHostAddress *)&local_78,&local_40,(ConversionMode)0x0);
          QHostAddress::~QHostAddress((QHostAddress *)&local_78);
          if (bVar1) {
            QtPrivate::
            QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
            ::~QExplicitlySharedDataPointerV2
                      ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
                        *)&local_58);
            bVar1 = true;
            goto LAB_00250169;
          }
          _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
        } while (_Var2._M_node != pVar5.second._M_node._M_node);
      }
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
                *)&local_58);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr._0_4_ = 0xaaaaaaaa;
  local_58.d.ptr._4_4_ = 0xaaaaaaaa;
  QUrl::toAce(&local_78,peerName,0);
  QVar4.m_data = (storage_type *)local_78.size;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar4);
  if (&(local_78.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,1,0x10);
    }
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QSslCertificate::subjectInfo((QStringList *)&local_78,cert,CommonName);
  if ((storage_type *)local_78.size != (storage_type *)0x0) {
    lVar3 = local_78.size * 0x18;
    cn = local_78.ptr;
    do {
      bVar1 = isMatchingHostname(cn,&local_58);
      if (bVar1) {
        bVar1 = true;
        goto LAB_0025012e;
      }
      cn = cn + 1;
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != 0);
  }
  local_80.d.d.ptr = (QExplicitlySharedDataPointer<QSslCertificatePrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QSslCertificate::subjectAlternativeNames(&local_80);
  local_84 = DnsEntry;
  if (local_80.d.d.ptr != (totally_ordered_wrapper<QSslCertificatePrivate_*>)0x0) {
    pVar5 = std::
            _Rb_tree<QSsl::AlternativeNameEntryType,_std::pair<const_QSsl::AlternativeNameEntryType,_QString>,_std::_Select1st<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
            ::equal_range((_Rb_tree<QSsl::AlternativeNameEntryType,_std::pair<const_QSsl::AlternativeNameEntryType,_QString>,_std::_Select1st<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>
                           *)((long)local_80.d.d.ptr + 8),&local_84);
    _Var2 = pVar5.first._M_node;
    if (_Var2._M_node != pVar5.second._M_node._M_node) {
      do {
        bVar1 = isMatchingHostname((QString *)&_Var2._M_node[1]._M_parent,&local_58);
        if (bVar1) break;
        _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node);
      } while (_Var2._M_node != pVar5.second._M_node._M_node);
      goto LAB_00250120;
    }
  }
  bVar1 = false;
LAB_00250120:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::multimap<QSsl::AlternativeNameEntryType,_QString,_std::less<QSsl::AlternativeNameEntryType>,_std::allocator<std::pair<const_QSsl::AlternativeNameEntryType,_QString>_>_>_>_>
              *)&local_80);
LAB_0025012e:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00250169:
  QHostAddress::~QHostAddress(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QSslSocketPrivate::isMatchingHostname(const QSslCertificate &cert, const QString &peerName)
{
    QHostAddress hostAddress(peerName);
    if (!hostAddress.isNull()) {
        const auto subjectAlternativeNames = cert.subjectAlternativeNames();
        const auto ipAddresses = subjectAlternativeNames.equal_range(QSsl::AlternativeNameEntryType::IpAddressEntry);

        for (auto it = ipAddresses.first; it != ipAddresses.second; it++) {
            if (QHostAddress(*it).isEqual(hostAddress, QHostAddress::StrictConversion))
                return true;
        }
    }

    const QString lowerPeerName = QString::fromLatin1(QUrl::toAce(peerName));
    const QStringList commonNames = cert.subjectInfo(QSslCertificate::CommonName);

    for (const QString &commonName : commonNames) {
        if (isMatchingHostname(commonName, lowerPeerName))
            return true;
    }

    const auto subjectAlternativeNames = cert.subjectAlternativeNames();
    const auto altNames = subjectAlternativeNames.equal_range(QSsl::DnsEntry);
    for (auto it = altNames.first; it != altNames.second; ++it) {
        if (isMatchingHostname(*it, lowerPeerName))
            return true;
    }

    return false;
}